

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock-problem-builder.h
# Opt level: O0

void __thiscall MockProblemBuilder::MockProblemBuilder(MockProblemBuilder *this)

{
  long in_RDI;
  FunctionMocker<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *this_00;
  FunctionMocker<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
  *in_stack_fffffffffffffe00;
  
  testing::internal::FunctionMocker<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>::
  FunctionMocker((FunctionMocker<mp::BasicSuffixSet<std::allocator<char>_>_&(int)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<int_()>::FunctionMocker
            ((FunctionMocker<int_()> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<int_()>::FunctionMocker
            ((FunctionMocker<int_()> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<int_()>::FunctionMocker
            ((FunctionMocker<int_()> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(const_mp::NLProblemInfo_&)>::FunctionMocker
            ((FunctionMocker<void_(const_mp::NLProblemInfo_&)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_()>::FunctionMocker
            ((FunctionMocker<void_()> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(double,_double,_mp::var::Type)>::FunctionMocker
            ((FunctionMocker<void_(double,_double,_mp::var::Type)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(int,_mp::var::Type)>::FunctionMocker
            ((FunctionMocker<void_(int,_mp::var::Type)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(mp::obj::Type)>::FunctionMocker
            ((FunctionMocker<void_(mp::obj::Type)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker
            ((FunctionMocker<void_(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(double,_double)>::FunctionMocker
            ((FunctionMocker<void_(double,_double)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(BasicTestExpr<2>)>::FunctionMocker
            ((FunctionMocker<void_(BasicTestExpr<2>)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker
            ((FunctionMocker<void_(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker
            ((FunctionMocker<void_(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<MockProblemBuilder::MutCommonExpr_&(int)>::FunctionMocker
            ((FunctionMocker<MockProblemBuilder::MutCommonExpr_&(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)>::
  FunctionMocker((FunctionMocker<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker
            ((FunctionMocker<void_(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(int,_int,_mp::ComplInfo)>::FunctionMocker
            ((FunctionMocker<void_(int,_int,_mp::ComplInfo)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<MockProblemBuilder::MutVariable_&(int)>::FunctionMocker
            ((FunctionMocker<MockProblemBuilder::MutVariable_&(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<MockProblemBuilder::Objective_&(int)>::FunctionMocker
            ((FunctionMocker<MockProblemBuilder::Objective_&(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<MockProblemBuilder::AlgebraicCon_&(int)>::FunctionMocker
            ((FunctionMocker<MockProblemBuilder::AlgebraicCon_&(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<MockProblemBuilder::LogicalCon_&(int)>::FunctionMocker
            ((FunctionMocker<MockProblemBuilder::LogicalCon_&(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestColumnSizeHandler_()>::FunctionMocker
            ((FunctionMocker<TestColumnSizeHandler_()> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<void_(int)>::FunctionMocker
            ((FunctionMocker<void_(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>::
  FunctionMocker((FunctionMocker<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::
  FunctionMocker<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>::FunctionMocker
            (in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestFunction_(int)>::FunctionMocker
            ((FunctionMocker<TestFunction_(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::
  FunctionMocker((FunctionMocker<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::
  FunctionMocker<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::
  FunctionMocker((FunctionMocker<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
                  *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(double)>::FunctionMocker
            ((FunctionMocker<BasicTestExpr<1>_(double)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestReference_(int)>::FunctionMocker
            ((FunctionMocker<TestReference_(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestReference_(int)>::FunctionMocker
            ((FunctionMocker<TestReference_(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::
  FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                  *)in_stack_fffffffffffffe00);
  testing::internal::
  FunctionMocker<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                  *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestPLTermBuilder_(int)>::FunctionMocker
            ((FunctionMocker<TestPLTermBuilder_(int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestCallExprBuilder_(TestFunction,_int)>::FunctionMocker
            ((FunctionMocker<TestCallExprBuilder_(TestFunction,_int)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestCallExprBuilder)>::FunctionMocker
            ((FunctionMocker<BasicTestExpr<1>_(TestCallExprBuilder)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  FunctionMocker((FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::FunctionMocker
            ((FunctionMocker<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *)
             in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::FunctionMocker
            ((FunctionMocker<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *)
             in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
  FunctionMocker((FunctionMocker<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>::
  FunctionMocker((FunctionMocker<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>::
  FunctionMocker((FunctionMocker<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<2>_(bool)>::FunctionMocker
            ((FunctionMocker<BasicTestExpr<2>_(bool)> *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>)>::FunctionMocker
            ((FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>)> *)in_stack_fffffffffffffe00);
  testing::internal::
  FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
                  *)in_stack_fffffffffffffe00);
  testing::internal::
  FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                  *)in_stack_fffffffffffffe00);
  testing::internal::
  FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::FunctionMocker
            ((FunctionMocker<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *)
             in_stack_fffffffffffffe00);
  testing::internal::
  FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
                  *)in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::
  FunctionMocker((FunctionMocker<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  FunctionMocker((FunctionMocker<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
                 in_stack_fffffffffffffe00);
  testing::internal::FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
  FunctionMocker((FunctionMocker<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *)
                 in_stack_fffffffffffffe00);
  this_00 = (FunctionMocker<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
             *)(in_RDI + 0x1af0);
  testing::internal::FunctionMocker<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::FunctionMocker
            ((FunctionMocker<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)this_00);
  testing::internal::
  FunctionMocker<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>::
  FunctionMocker(this_00);
  testing::internal::FunctionMocker<MockProblemBuilder_&()>::FunctionMocker
            ((FunctionMocker<MockProblemBuilder_&()> *)this_00);
  return;
}

Assistant:

MockProblemBuilder() {}